

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,uint value)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  uint *in_RDI;
  int cLevel;
  uint local_1c;
  ulong local_8;
  
  if (in_ESI == 10) {
    if (in_EDX < 2) {
      *in_RDI = in_EDX;
      local_8 = (ulong)*in_RDI;
    }
    else {
      local_8 = 0xffffffffffffffd8;
    }
  }
  else if (in_ESI == 100) {
    iVar1 = ZSTD_maxCLevel();
    local_1c = in_EDX;
    if (iVar1 < (int)in_EDX) {
      local_1c = ZSTD_maxCLevel();
    }
    if (local_1c != 0) {
      in_RDI[0xc] = (uint)((int)local_1c < 0);
      in_RDI[0xb] = local_1c;
    }
    if ((int)in_RDI[0xb] < 0) {
      local_8 = 0;
    }
    else {
      local_8 = (ulong)(int)in_RDI[0xb];
    }
  }
  else if (in_ESI == 0x65) {
    if ((in_EDX == 0) || (9 < in_EDX && in_EDX < 0x20)) {
      in_RDI[1] = in_EDX;
      local_8 = (ulong)in_RDI[1];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x66) {
    if ((in_EDX == 0) || (5 < in_EDX && in_EDX < 0x1f)) {
      in_RDI[3] = in_EDX;
      local_8 = (ulong)in_RDI[3];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x67) {
    if ((in_EDX == 0) || (5 < in_EDX && in_EDX < 0x1f)) {
      in_RDI[2] = in_EDX;
      local_8 = (ulong)in_RDI[2];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x68) {
    if ((in_EDX == 0) || (in_EDX != 0 && in_EDX < 0x1f)) {
      in_RDI[4] = in_EDX;
      local_8 = (ulong)in_EDX;
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x69) {
    if ((in_EDX == 0) || (2 < in_EDX && in_EDX < 8)) {
      in_RDI[5] = in_EDX;
      local_8 = (ulong)in_RDI[5];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0x6a) {
    in_RDI[6] = in_EDX;
    local_8 = (ulong)in_RDI[6];
  }
  else if (in_ESI == 0x6b) {
    if ((in_EDX == 0) || (in_EDX != 0 && in_EDX < 9)) {
      in_RDI[7] = in_EDX;
      local_8 = (ulong)in_RDI[7];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa0) {
    in_RDI[0x11] = (uint)(in_EDX != 0);
    local_8 = (ulong)in_RDI[0x11];
  }
  else if (in_ESI == 0xa1) {
    if ((in_EDX == 0) || (5 < in_EDX && in_EDX < 0x1f)) {
      in_RDI[0x12] = in_EDX;
      local_8 = (ulong)in_RDI[0x12];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa2) {
    if ((in_EDX == 0) || (3 < in_EDX && in_EDX < 0x1001)) {
      in_RDI[0x14] = in_EDX;
      local_8 = (ulong)in_RDI[0x14];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa3) {
    if (in_EDX < 9) {
      in_RDI[0x13] = in_EDX;
      local_8 = (ulong)in_RDI[0x13];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 0xa4) {
    if (in_EDX < 0x1a) {
      in_RDI[0x15] = in_EDX;
      local_8 = (ulong)in_RDI[0x15];
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else if (in_ESI == 200) {
    in_RDI[8] = (uint)(in_EDX != 0);
    local_8 = (ulong)in_RDI[8];
  }
  else if (in_ESI == 0xc9) {
    in_RDI[9] = (uint)(in_EDX != 0);
    local_8 = (ulong)in_RDI[9];
  }
  else if (in_ESI == 0xca) {
    in_RDI[10] = (uint)((in_EDX != 0 ^ 0xffU) & 1);
    local_8 = (ulong)(int)(uint)((in_RDI[10] != 0 ^ 0xffU) & 1);
  }
  else if (in_ESI == 400) {
    if (in_EDX == 0) {
      local_8 = 0;
    }
    else {
      local_8 = 0xffffffffffffffd8;
    }
  }
  else if (in_ESI == 0x191) {
    local_8 = 0xffffffffffffffd8;
  }
  else if (in_ESI == 0x192) {
    local_8 = 0xffffffffffffffd8;
  }
  else if (in_ESI == 1000) {
    in_RDI[0xc] = (uint)((in_EDX != 0 ^ 0xffU) & 1);
    local_8 = (ulong)(int)(uint)((in_RDI[0xc] != 0 ^ 0xffU) & 1);
  }
  else if (in_ESI == 0x44c) {
    in_RDI[0xd] = (uint)(in_EDX != 0);
    local_8 = (ulong)(int)in_RDI[0xd];
  }
  else {
    local_8 = 0xffffffffffffffd8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtxParam_setParameter(
        ZSTD_CCtx_params* CCtxParams, ZSTD_cParameter param, unsigned value)
{
    DEBUGLOG(4, "ZSTD_CCtxParam_setParameter (%u, %u)", (U32)param, value);
    switch(param)
    {
    case ZSTD_p_format :
        if (value > (unsigned)ZSTD_f_zstd1_magicless)
            return ERROR(parameter_unsupported);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_p_compressionLevel : {
        int cLevel = (int)value;  /* cast expected to restore negative sign */
        if (cLevel > ZSTD_maxCLevel()) cLevel = ZSTD_maxCLevel();
        if (cLevel) {  /* 0 : does not change current level */
            CCtxParams->disableLiteralCompression = (cLevel<0);  /* negative levels disable huffman */
            CCtxParams->compressionLevel = cLevel;
        }
        if (CCtxParams->compressionLevel >= 0) return CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_p_windowLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_WINDOWLOG_MIN, ZSTD_WINDOWLOG_MAX);
        CCtxParams->cParams.windowLog = value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_p_hashLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
        CCtxParams->cParams.hashLog = value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_p_chainLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_CHAINLOG_MIN, ZSTD_CHAINLOG_MAX);
        CCtxParams->cParams.chainLog = value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_p_searchLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_SEARCHLOG_MIN, ZSTD_SEARCHLOG_MAX);
        CCtxParams->cParams.searchLog = value;
        return value;

    case ZSTD_p_minMatch :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_SEARCHLENGTH_MIN, ZSTD_SEARCHLENGTH_MAX);
        CCtxParams->cParams.searchLength = value;
        return CCtxParams->cParams.searchLength;

    case ZSTD_p_targetLength :
        /* all values are valid. 0 => use default */
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_p_compressionStrategy :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, (unsigned)ZSTD_fast, (unsigned)ZSTD_btultra);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_p_compressLiterals:
        CCtxParams->disableLiteralCompression = !value;
        return !CCtxParams->disableLiteralCompression;

    case ZSTD_p_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value>0));
        CCtxParams->fParams.contentSizeFlag = value > 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_p_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value > 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_p_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value>0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_p_forceMaxWindow :
        CCtxParams->forceWindow = (value > 0);
        return CCtxParams->forceWindow;

    case ZSTD_p_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        if (value>0) return ERROR(parameter_unsupported);
        return 0;
#else
        return ZSTDMT_CCtxParam_setNbWorkers(CCtxParams, value);
#endif

    case ZSTD_p_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_jobSize, value);
#endif

    case ZSTD_p_overlapSizeLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_overlapSectionLog, value);
#endif

    case ZSTD_p_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value>0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_p_ldmHashLog :
        if (value>0)   /* 0 ==> auto */
            CLAMPCHECK(value, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_p_ldmMinMatch :
        if (value>0)   /* 0 ==> default */
            CLAMPCHECK(value, ZSTD_LDM_MINMATCH_MIN, ZSTD_LDM_MINMATCH_MAX);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_p_ldmBucketSizeLog :
        if (value > ZSTD_LDM_BUCKETSIZELOG_MAX)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_p_ldmHashEveryLog :
        if (value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.hashEveryLog = value;
        return CCtxParams->ldmParams.hashEveryLog;

    default: return ERROR(parameter_unsupported);
    }
}